

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O2

vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_> *
msgpack11::MsgPack::parse_multi
          (vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_> *__return_storage_ptr__,
          string *in,size_type *parser_stop_pos,string *err)

{
  MsgPackParser parser;
  MsgPackParser local_60;
  string *local_40;
  byte local_38;
  
  local_60._24_8_ = 0;
  local_38 = 0;
  *parser_stop_pos = 0;
  (__return_storage_ptr__->
  super__Vector_base<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.err = in;
  local_40 = err;
  while ((local_60._24_8_ != in->_M_string_length && ((local_38 & 1) == 0))) {
    anon_unknown_0::MsgPackParser::parse_msgpack(&local_60,(int)&local_60 + 0x10);
    std::vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>::
    emplace_back<msgpack11::MsgPack>(__return_storage_ptr__,(MsgPack *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.i);
    if (local_38 == 0) {
      *parser_stop_pos = local_60._24_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<MsgPack> MsgPack::parse_multi(const string &in,
                                     std::string::size_type &parser_stop_pos,
                                     string &err) {
    MsgPackParser parser { in, 0, err, false };
    parser_stop_pos = 0;
    vector<MsgPack> msgpack_vec;
    while (parser.i != in.size() && !parser.failed) {
        msgpack_vec.push_back(parser.parse_msgpack(0));
        if (!parser.failed)
            parser_stop_pos = parser.i;
    }
    return msgpack_vec;
}